

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

bool test_remove_gap4b(Data *data,int offset)

{
  pointer puVar1;
  int iVar2;
  LogHelper *pLVar3;
  int iVar4;
  bool bVar5;
  uint8_t fill;
  int len;
  int local_44;
  TrackDataParser parser;
  
  puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = *(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar1;
  if (iVar4 < offset) {
LAB_00165150:
    bVar5 = false;
  }
  else {
    TrackDataParser::TrackDataParser(&parser,puVar1 + offset,iVar4 - offset);
    local_44 = 0;
    len = 0;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [16])"----gap4b----:\n");
    }
    TrackDataParser::GetGapRun(&parser,&len,&fill,(bool *)0x0);
    if (len == 0) {
      iVar4 = 1;
      do {
        local_44 = iVar4;
        iVar2 = TrackDataParser::GetGapRun(&parser,&len,&fill,(bool *)0x0);
        if (iVar2 == 0) break;
        iVar4 = iVar4 + 1;
      } while (len == 0);
      if (opt.debug != 0) {
        pLVar3 = util::operator<<((LogHelper *)&util::cout,(char (*) [7])"found ");
        pLVar3 = util::operator<<(pLVar3,&local_44);
        util::operator<<(pLVar3,(char (*) [14])0x1a9345);
      }
    }
    if (0 < len) {
      if ((fill != 'N') && (fill != '\0')) {
        if (opt.debug != 0) {
          pLVar3 = util::operator<<((LogHelper *)&util::cout,(char (*) [17])"stopping due to ");
          pLVar3 = util::operator<<(pLVar3,&len);
          pLVar3 = util::operator<<(pLVar3,(char (*) [11])" bytes of ");
          pLVar3 = util::operator<<(pLVar3,&fill);
          util::operator<<(pLVar3,(char (*) [9])" filler\n");
        }
        goto LAB_00165150;
      }
      if (opt.debug == 0) {
        return true;
      }
      pLVar3 = util::operator<<((LogHelper *)&util::cout,(char (*) [7])"found ");
      pLVar3 = util::operator<<(pLVar3,&len);
      pLVar3 = util::operator<<(pLVar3,(char (*) [11])" bytes of ");
      pLVar3 = util::operator<<(pLVar3,&fill);
      util::operator<<(pLVar3,(char (*) [9])" filler\n");
    }
    bVar5 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [22])"gap4b can be removed\n");
    }
  }
  return bVar5;
}

Assistant:

bool test_remove_gap4b(const Data& data, int offset)
{
    if (data.size() < offset)
        return false;

    TrackDataParser parser(data.data() + offset, data.size() - offset);
    auto splice = 0, len = 0;
    uint8_t fill;

    if (opt.debug) util::cout << "----gap4b----:\n";

    parser.GetGapRun(len, fill);

    if (!len)
    {
        splice = 1;
        for (; parser.GetGapRun(len, fill) && !len; ++splice);
        if (opt.debug) util::cout << "found " << splice << " splice bits\n";
        /*
        auto max_splice = (opt.maxsplice == -1) ? DEFAULT_MAX_SPLICE : opt.maxsplice;
        if (splice > max_splice)
        {
        if (opt.debug) util::cout << "stopping due to too many splice bits\n";
        return false;
        }
        */
    }

    if (len > 0 && (fill == 0x4e || fill == 0x00))
    {
        if (opt.debug) util::cout << "found " << len << " bytes of " << fill << " filler\n";
    }
    else if (len > 0)
    {
        if (opt.debug) util::cout << "stopping due to " << len << " bytes of " << fill << " filler\n";
        return false;
    }

    if (opt.debug) util::cout << "gap4b can be removed\n";
    return true;
}